

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,signed_char,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
               (char *idata,AggregateInputData *aggr_input_data,
               ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  sel_t *psVar1;
  bool bVar2;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  
  psVar1 = sel_vector->sel_vector;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      iVar3 = iVar4;
      if (psVar1 != (sel_t *)0x0) {
        iVar3 = (idx_t)psVar1[iVar4];
      }
      BaseModeFunction<duckdb::ModeStandard<signed_char>>::
      Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                (state,idata + iVar3,aggr_input_data);
    }
  }
  else {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      iVar3 = iVar4;
      if (psVar1 != (sel_t *)0x0) {
        iVar3 = (idx_t)psVar1[iVar4];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,iVar3);
      if (bVar2) {
        BaseModeFunction<duckdb::ModeStandard<signed_char>>::
        Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                  (state,idata + iVar3,aggr_input_data);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}